

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::split_program_name
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *commandline)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  byte bVar3;
  pointer pcVar4;
  ulong uVar5;
  byte *pbVar6;
  _Alloc_hider __s;
  char cVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  void *pvVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  size_type __pos;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  byte bVar12;
  char *__data;
  ulong uVar13;
  ulong uVar14;
  size_type __size;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  size_type *local_b8;
  size_type local_b0;
  size_type local_a8;
  undefined8 uStack_a0;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  path local_88;
  byte *local_60;
  size_type local_58;
  byte local_50;
  undefined1 uStack_4f;
  undefined6 uStack_4e;
  error_code local_40;
  
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (commandline->_M_dataplus)._M_p;
  local_88._M_pathname._M_dataplus._M_p = local_d8._M_dataplus._M_p + commandline->_M_string_length;
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_98);
  commandline->_M_string_length = local_98._M_len - (long)(commandline->_M_dataplus)._M_p;
  *(undefined1 *)local_98._M_len = 0;
  _Var8 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar4 = (commandline->_M_dataplus)._M_p;
  if (pcVar4 + commandline->_M_string_length == _Var8._M_current) {
    commandline->_M_string_length = 0;
    *pcVar4 = '\0';
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
              (commandline,0,(long)_Var8._M_current - (long)pcVar4);
  }
  uVar13 = 0xffffffffffffffff;
  if (1 < commandline->_M_string_length) {
    pcVar4 = (commandline->_M_dataplus)._M_p;
    pvVar9 = memchr(pcVar4 + 1,0x20,commandline->_M_string_length - 1);
    uVar13 = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)pcVar4;
  }
  do {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_d8,commandline,0,uVar13);
    __s._M_p = local_d8._M_dataplus._M_p;
    local_40._M_value = 0;
    local_40._M_cat = (error_category *)::std::_V2::system_category();
    local_98._M_len = strlen(__s._M_p);
    local_98._M_str = __s._M_p;
    ::std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_88,&local_98,auto_format);
    cVar7 = ::std::filesystem::status(&local_88,&local_40);
    std::filesystem::__cxx11::path::~path((path *)&local_88);
    if (local_40._M_value == 0) {
      bVar12 = 1;
      if ((byte)(cVar7 + 1U) < 4) {
        bVar12 = 4 >> (cVar7 + 1U & 0xf);
      }
    }
    else {
      bVar12 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar12 & 1) != 0) goto LAB_001bef5a;
    uVar14 = uVar13 + 1;
    uVar5 = commandline->_M_string_length;
    uVar13 = 0xffffffffffffffff;
    if (uVar14 <= uVar5 && uVar5 - uVar14 != 0) {
      pcVar4 = (commandline->_M_dataplus)._M_p;
      pvVar9 = memchr(pcVar4 + uVar14,0x20,uVar5 - uVar14);
      uVar13 = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)pcVar4;
    }
  } while (uVar13 != 0xffffffffffffffff);
  pbVar6 = (byte *)(commandline->_M_dataplus)._M_p;
  bVar12 = *pbVar6;
  if ((bVar12 - 0x22 < 0x3f) && ((0x4000000000000021U >> ((ulong)(bVar12 - 0x22) & 0x3f) & 1) != 0))
  {
    uVar13 = 0xffffffffffffffff;
    if (1 < uVar5) {
      pvVar9 = memchr(pbVar6 + 1,(int)(char)bVar12,uVar5 - 1);
      uVar13 = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)pbVar6;
    }
    if (uVar13 != 0xffffffffffffffff) {
      bVar2 = pbVar6[uVar13 - 1];
      bVar3 = bVar2;
      while (bVar3 == 0x5c) {
        uVar14 = uVar13 + 1;
        uVar13 = 0xffffffffffffffff;
        if (uVar14 <= uVar5 && uVar5 - uVar14 != 0) {
          pvVar9 = memchr(pbVar6 + uVar14,(int)(char)bVar12,uVar5 - uVar14);
          uVar13 = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)pbVar6;
        }
        if (uVar13 == 0xffffffffffffffff) goto LAB_001bedde;
        bVar3 = pbVar6[uVar13 - 1];
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                 commandline,1,uVar13 - 1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&__return_storage_ptr__->first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
      paVar1 = &local_88._M_pathname.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_pathname._M_dataplus._M_p,
                        local_88._M_pathname.field_2._M_allocated_capacity + 1);
      }
      uVar13 = uVar13 + 1;
      if (bVar2 == 0x5c) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        pcVar4 = (__return_storage_ptr__->first)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,pcVar4,
                   pcVar4 + (__return_storage_ptr__->first)._M_string_length);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\\","");
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_replace_aux(&local_d8,local_d8._M_string_length,0,1,bVar12);
        local_b8 = (size_type *)(pbVar10->_M_dataplus)._M_p;
        paVar11 = &pbVar10->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8 == paVar11) {
          local_a8 = paVar11->_M_allocated_capacity;
          uStack_a0 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          local_b8 = &local_a8;
        }
        else {
          local_a8 = paVar11->_M_allocated_capacity;
        }
        local_b0 = pbVar10->_M_string_length;
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        local_58 = 1;
        uStack_4f = 0;
        local_60 = &local_50;
        local_50 = bVar12;
        __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&local_f8,(char *)local_b8,0,local_b0);
        if (__pos != 0xffffffffffffffff) {
          do {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&local_f8,__pos,local_b0,(char *)local_60,local_58);
            __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find(&local_f8,(char *)local_b8,__pos + local_58,local_b0);
          } while (__pos != 0xffffffffffffffff);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
          local_88._M_pathname.field_2._8_8_ = local_f8.field_2._8_8_;
          local_88._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_88._M_pathname._M_dataplus._M_p = local_f8._M_dataplus._M_p;
        }
        local_88._M_pathname.field_2._M_allocated_capacity._1_7_ =
             local_f8.field_2._M_allocated_capacity._1_7_;
        local_88._M_pathname.field_2._M_local_buf[0] = local_f8.field_2._M_local_buf[0];
        local_88._M_pathname._M_string_length = local_f8._M_string_length;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&__return_storage_ptr__->first,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_pathname._M_dataplus._M_p,
                          local_88._M_pathname.field_2._M_allocated_capacity + 1);
        }
        if (local_60 != &local_50) {
          operator_delete(local_60,CONCAT62(uStack_4e,CONCAT11(uStack_4f,local_50)) + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                   local_f8.field_2._M_local_buf[0]) + 1);
        }
      }
      goto LAB_001bef5a;
    }
  }
LAB_001bedde:
  uVar13 = 0xffffffffffffffff;
  if (1 < uVar5) {
    pvVar9 = memchr(pbVar6 + 1,0x20,uVar5 - 1);
    uVar13 = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)pbVar6;
  }
LAB_001bef5a:
  if ((__return_storage_ptr__->first)._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               commandline,0,uVar13);
    split_program_name();
    local_d8._M_dataplus._M_p = (__return_storage_ptr__->first)._M_dataplus._M_p;
    local_88._M_pathname._M_dataplus._M_p =
         local_d8._M_dataplus._M_p + (__return_storage_ptr__->first)._M_string_length;
    ::std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
              (&local_98,&local_88);
    (__return_storage_ptr__->first)._M_string_length =
         local_98._M_len - (long)(__return_storage_ptr__->first)._M_dataplus._M_p;
    *(undefined1 *)local_98._M_len = 0;
  }
  if (uVar13 < commandline->_M_string_length - 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               commandline,uVar13 + 1,0xffffffffffffffff);
  }
  else {
    local_88._M_pathname._M_dataplus._M_p = (pointer)&local_88._M_pathname.field_2;
    local_88._M_pathname._M_string_length = 0;
    local_88._M_pathname.field_2._M_allocated_capacity =
         local_88._M_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  }
  split_program_name();
  _Var8 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar4 = (__return_storage_ptr__->second)._M_dataplus._M_p;
  if (pcVar4 + (__return_storage_ptr__->second)._M_string_length == _Var8._M_current) {
    (__return_storage_ptr__->second)._M_string_length = 0;
    *pcVar4 = '\0';
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
              (&__return_storage_ptr__->second,0,(long)_Var8._M_current - (long)pcVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::pair<std::string, std::string> split_program_name(std::string commandline) {
    // try to determine the programName
    std::pair<std::string, std::string> vals;
    trim(commandline);
    auto esp = commandline.find_first_of(' ', 1);
    while(detail::check_path(commandline.substr(0, esp).c_str()) != path_type::file) {
        esp = commandline.find_first_of(' ', esp + 1);
        if(esp == std::string::npos) {
            // if we have reached the end and haven't found a valid file just assume the first argument is the
            // program name
            if(commandline[0] == '"' || commandline[0] == '\'' || commandline[0] == '`') {
                bool embeddedQuote = false;
                auto keyChar = commandline[0];
                auto end = commandline.find_first_of(keyChar, 1);
                while((end != std::string::npos) && (commandline[end - 1] == '\\')) {  // deal with escaped quotes
                    end = commandline.find_first_of(keyChar, end + 1);
                    embeddedQuote = true;
                }
                if(end != std::string::npos) {
                    vals.first = commandline.substr(1, end - 1);
                    esp = end + 1;
                    if(embeddedQuote) {
                        vals.first = find_and_replace(vals.first, std::string("\\") + keyChar, std::string(1, keyChar));
                    }
                } else {
                    esp = commandline.find_first_of(' ', 1);
                }
            } else {
                esp = commandline.find_first_of(' ', 1);
            }

            break;
        }
    }
    if(vals.first.empty()) {
        vals.first = commandline.substr(0, esp);
        rtrim(vals.first);
    }

    // strip the program name
    vals.second = (esp < commandline.length() - 1) ? commandline.substr(esp + 1) : std::string{};
    ltrim(vals.second);
    return vals;
}